

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

void __thiscall cmFileInstaller::ManifestAppend(cmFileInstaller *this,string *file)

{
  long *local_38 [2];
  long local_28 [2];
  
  if ((this->Manifest)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->Manifest);
  }
  std::__cxx11::string::substr((ulong)local_38,(ulong)file);
  std::__cxx11::string::_M_append((char *)&this->Manifest,(ulong)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void cmFileInstaller::ManifestAppend(std::string const& file)
{
  if (!this->Manifest.empty()) {
    this->Manifest += ";";
  }
  this->Manifest += file.substr(this->DestDirLength);
}